

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O3

int run_test_connection_fail_doesnt_auto_close(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  long local_18;
  long local_10;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer);
  local_10 = (long)iVar1;
  local_18 = 0;
  if (local_10 == 0) {
    connection_fail(on_connect_without_close);
    local_10 = 1;
    local_18 = (long)timer_close_cb_calls;
    if (local_18 != 1) goto LAB_001845cb;
    local_10 = 1;
    local_18 = (long)timer_cb_calls;
    if (local_18 == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_10 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      local_18 = (long)iVar1;
      if (local_10 == local_18) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001845e5;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_001845cb:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_001845e5:
  iVar1 = (int)&local_18;
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar1 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return 0;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(connection_fail_doesnt_auto_close) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  connection_fail(on_connect_without_close);

  ASSERT_EQ(1, timer_close_cb_calls);
  ASSERT_EQ(1, timer_cb_calls);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}